

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_>
* inja::string_view::split
            (pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_>
             *__return_storage_ptr__,string_view view,char Separator)

{
  size_type start;
  size_t in_R8;
  string_view sVar1;
  string_view sVar2;
  string_view view_local;
  
  view_local.size_ = view.size_;
  view_local.data_ = view.data_;
  start = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find
                    (&view_local,Separator,0);
  if (start == 0xffffffffffffffff) {
    (__return_storage_ptr__->second).data_ = (const_pointer)0x0;
    (__return_storage_ptr__->second).size_ = 0;
    (__return_storage_ptr__->first).data_ = view_local.data_;
    (__return_storage_ptr__->first).size_ = view_local.size_;
  }
  else {
    sVar1.size_ = 0;
    sVar1.data_ = (const_pointer)view_local.size_;
    sVar1 = slice((string_view *)view_local.data_,sVar1,start,in_R8);
    sVar2.size_ = start + 1;
    sVar2.data_ = (const_pointer)view_local.size_;
    sVar2 = slice((string_view *)view_local.data_,sVar2,0xffffffffffffffff,in_R8);
    (__return_storage_ptr__->first).data_ = sVar1.data_;
    (__return_storage_ptr__->first).size_ = sVar1.size_;
    (__return_storage_ptr__->second).data_ = sVar2.data_;
    (__return_storage_ptr__->second).size_ = sVar2.size_;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<nonstd::string_view, nonstd::string_view> split(nonstd::string_view view, char Separator) {
	size_t idx = view.find(Separator);
	if (idx == nonstd::string_view::npos) {
		return std::make_pair(view, nonstd::string_view());
	}
	return std::make_pair(slice(view, 0, idx), slice(view, idx + 1, nonstd::string_view::npos));
}